

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppMetadataTest_AnnotatesCordSemantics_Test::
TestBody(CppMetadataTest_AnnotatesCordSemantics_Test *this)

{
  char *pcVar1;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  pointer ppGVar5;
  pointer ppGVar6;
  undefined8 __s1;
  int iVar7;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar8;
  size_type __rlen;
  char *pcVar9;
  GeneratedCodeInfo *in_R8;
  undefined1 annotation [8];
  string *in_R9;
  size_type __rlen_2;
  pointer *__ptr;
  pointer ppGVar10;
  initializer_list<int> __l;
  string_view data;
  string_view file_content;
  string_view file_content_00;
  string_view filename;
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  annotations;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> substring;
  vector<int,_std::allocator<int>_> field_path;
  string pb_h;
  GeneratedCodeInfo info;
  FileDescriptorProto file;
  GeneratedCodeInfo *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined1 local_1f8 [8];
  undefined1 auStack_1f0 [8];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  local_1c8;
  AssertHelper local_1b0;
  undefined1 local_1a8 [16];
  bool local_198;
  undefined1 local_190 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  pointer local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  GeneratedCodeInfo local_158;
  undefined1 local_128 [248];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_128,(Arena *)0x0);
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)(local_168 + 0x10),(Arena *)0x0);
  local_178._0_8_ = local_168;
  local_178._8_8_ = (annotation_test_util *)0x0;
  local_168[0] = 0;
  data._M_str = 
  "\n    syntax = \"proto2\";\n    package foo;\n    message Message {\n      optional string sfield = 1 [ctype = CORD];\n      repeated string rsfield = 2 [ctype = CORD];\n    }\n"
  ;
  data._M_len = 0xa8;
  filename._M_str = "test.proto";
  filename._M_len = 10;
  annotation_test_util::AddFile(filename,data);
  local_1f8 = (undefined1  [8])local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"test.proto","");
  local_190[0] = (internal)
                 CppMetadataTest::CaptureMetadata
                           ((CppMetadataTest *)local_1f8,(string *)local_128,
                            (FileDescriptorProto *)local_178,(string *)(local_168 + 0x10),in_R8,
                            in_R9,in_stack_fffffffffffffdf8,
                            (string *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00))
  ;
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1f8 == (undefined1  [8])local_1e8) {
    if ((bool)local_190[0]) goto LAB_00a30a4d;
  }
  else {
    operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
    if (((byte)local_190[0] & 1) != 0) goto LAB_00a30a4d;
  }
  testing::Message::Message((Message *)&local_1c8);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_1f8,(internal *)local_190,
             (AssertionResult *)
             "CaptureMetadata(\"test.proto\", &file, &pb_h, &info, nullptr, nullptr, nullptr)",
             "false","true",(char *)in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_1a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
             ,0x13d,(char *)local_1f8);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_1a8,(Message *)&local_1c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1a8);
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
  }
  if (local_1c8.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (**(code **)((long)*local_1c8.
                        super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                        ._M_impl.super__Vector_impl_data._M_start + 8))();
  }
LAB_00a30a4d:
  if (local_188 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_188,local_188);
  }
  pVVar8 = protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     ((RepeatedPtrFieldBase *)(local_128 + 0x30),0);
  annotation = (undefined1  [8])
               ((ulong)(pVVar8->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  testing::internal::CmpHelperEQ<char[8],std::__cxx11::string>
            ((internal *)local_1f8,"\"Message\"","file.message_type(0).name()",
             (char (*) [8])0x115bf86,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)annotation);
  if (local_1f8[0] == (string)0x0) {
    testing::Message::Message((Message *)local_190);
    if (auStack_1f0 == (undefined1  [8])0x0) {
      annotation = (undefined1  [8])(anon_var_dwarf_a22956 + 5);
    }
    else {
      annotation = *(undefined1 (*) [8])auStack_1f0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0x13e,(char *)annotation);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
    if ((long *)CONCAT71(local_190._1_7_,local_190[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_190._1_7_,local_190[0]) + 8))();
    }
  }
  if (auStack_1f0 != (undefined1  [8])0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1f0);
  }
  local_1f8 = (undefined1  [8])&DAT_00000004;
  auStack_1f0 = (undefined1  [8])0x2;
  __l._M_len = 4;
  __l._M_array = (iterator)local_1f8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_190,__l,(allocator_type *)&local_1c8);
  local_1c8.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8 = (undefined1  [8])local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"test.proto","");
  annotation_test_util::FindAnnotationsOnPath
            ((GeneratedCodeInfo *)(local_168 + 0x10),(string *)local_1f8,
             (vector<int,_std::allocator<int>_> *)local_190,&local_1c8);
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
  }
  local_1a8[0] = local_1c8.
                 super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_1c8.
                 super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  local_1a8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_1a8[0]) {
    testing::Message::Message((Message *)local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f8,(internal *)local_1a8,(AssertionResult *)"!annotations.empty()",
               "false","true",(char *)in_R9);
    annotation = local_1f8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0x143,(char *)local_1f8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe00);
    if (local_1f8 != (undefined1  [8])local_1e8) {
      operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
    }
    if ((long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1a8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1a8._8_8_);
    }
  }
  ppGVar5 = local_1c8.
            super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1c8.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_1c8.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    *(undefined4 *)((long)&local_188[-1].field_2 + 0xc) = 1;
  }
  else {
    ppGVar10 = local_1c8.
               super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar1 = (char *)*ppGVar10;
      file_content._M_str = pcVar1;
      file_content._M_len = local_178._0_8_;
      annotation_test_util::GetAnnotationSubstring
                ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_1a8,
                 (annotation_test_util *)local_178._8_8_,file_content,(Annotation *)annotation);
      local_1d8[0] = local_198;
      local_1d8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_198 == false) {
        testing::Message::Message((Message *)&stack0xfffffffffffffe00);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1f8,(internal *)local_1d8,
                   (AssertionResult *)"substring.has_value()","false","true",(char *)in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                   ,0x146,(char *)local_1f8);
        testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&stack0xfffffffffffffe00);
        goto LAB_00a313a9;
      }
      sVar2 = CONCAT71(local_1a8._1_7_,local_1a8[0]);
      switch(sVar2) {
      case 6:
        if ((short)*(int *)(local_1a8._8_8_ + 4) != 0x646c || *(int *)local_1a8._8_8_ != 0x65696673)
        goto switchD_00a30cda_caseD_7;
        local_1d8._0_4_ = (uint32_t  [1])0x0;
        in_stack_fffffffffffffe00 = *(undefined4 *)(pcVar1 + 0x40);
        annotation = (undefined1  [8])&stack0xfffffffffffffe00;
        testing::internal::
        CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                  ((internal *)local_1f8,"GeneratedCodeInfo_Annotation_Semantic_NONE",
                   "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)local_1d8,
                   (GeneratedCodeInfo_Annotation_Semantic *)&stack0xfffffffffffffe00);
        if (local_1f8[0] != (string)0x0) goto LAB_00a30ec3;
        testing::Message::Message((Message *)local_1d8);
        annotation = (undefined1  [8])(anon_var_dwarf_a22956 + 5);
        if ((_Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>)auStack_1f0 !=
            (_Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>)0x0) {
          annotation = *(undefined1 (*) [8])auStack_1f0;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                   ,0x149,(char *)annotation);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
        goto LAB_00a30eab;
      default:
        goto switchD_00a30cda_caseD_7;
      case 10:
        pcVar9 = "set_sfield";
        break;
      case 0xc:
        pcVar9 = "clear_sfield";
        break;
      case 0xe:
        iVar7 = bcmp((void *)local_1a8._8_8_,"mutable_sfield",sVar2);
        if (iVar7 != 0) goto switchD_00a30cda_caseD_7;
        local_1d8._0_4_ = (uint32_t  [1])0x2;
        in_stack_fffffffffffffe00 = *(undefined4 *)(pcVar1 + 0x40);
        annotation = (undefined1  [8])&stack0xfffffffffffffe00;
        testing::internal::
        CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                  ((internal *)local_1f8,"GeneratedCodeInfo_Annotation_Semantic_ALIAS",
                   "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)local_1d8,
                   (GeneratedCodeInfo_Annotation_Semantic *)&stack0xfffffffffffffe00);
        if (local_1f8[0] == (string)0x0) {
          testing::Message::Message((Message *)local_1d8);
          annotation = (undefined1  [8])(anon_var_dwarf_a22956 + 5);
          if ((_Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>)auStack_1f0 !=
              (_Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>)0x0) {
            annotation = *(undefined1 (*) [8])auStack_1f0;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                     ,0x14f,(char *)annotation);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
          goto LAB_00a30eab;
        }
        goto LAB_00a30ec3;
      }
      iVar7 = bcmp((void *)local_1a8._8_8_,pcVar9,sVar2);
      if (iVar7 == 0) {
        local_1d8._0_4_ = (uint32_t  [1])0x1;
        in_stack_fffffffffffffe00 = *(undefined4 *)(pcVar1 + 0x40);
        annotation = (undefined1  [8])&stack0xfffffffffffffe00;
        testing::internal::
        CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                  ((internal *)local_1f8,"GeneratedCodeInfo_Annotation_Semantic_SET",
                   "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)local_1d8,
                   (GeneratedCodeInfo_Annotation_Semantic *)&stack0xfffffffffffffe00);
        if (local_1f8[0] == (string)0x0) {
          testing::Message::Message((Message *)local_1d8);
          annotation = (undefined1  [8])(anon_var_dwarf_a22956 + 5);
          if ((_Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>)auStack_1f0 !=
              (_Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>)0x0) {
            annotation = *(undefined1 (*) [8])auStack_1f0;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                     ,0x14c,(char *)annotation);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
LAB_00a30eab:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe00);
          if ((long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + 8))();
          }
        }
LAB_00a30ec3:
        if (auStack_1f0 != (undefined1  [8])0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)auStack_1f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_1f0);
        }
      }
switchD_00a30cda_caseD_7:
      ppGVar10 = (pointer)((long *)ppGVar10 + 1);
    } while (ppGVar10 != ppGVar5);
    *(undefined4 *)((long)&local_188[-1].field_2 + 0xc) = 1;
    if (local_1c8.
        super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_1c8.
        super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_1c8.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_1c8.
           super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  local_1f8 = (undefined1  [8])local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"test.proto","");
  annotation_test_util::FindAnnotationsOnPath
            ((GeneratedCodeInfo *)(local_168 + 0x10),(string *)local_1f8,
             (vector<int,_std::allocator<int>_> *)local_190,&local_1c8);
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
  }
  local_1a8[0] = local_1c8.
                 super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_1c8.
                 super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  local_1a8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  ppGVar5 = local_1c8.
            super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppGVar10 = local_1c8.
             super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (!(bool)local_1a8[0]) {
    testing::Message::Message((Message *)local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1f8,(internal *)local_1a8,(AssertionResult *)"!annotations.empty()",
               "false","true",(char *)in_R9);
    annotation = local_1f8;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
               ,0x155,(char *)local_1f8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe00);
    if (local_1f8 != (undefined1  [8])local_1e8) {
      operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
    }
    if ((long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + 8))();
    }
    ppGVar5 = local_1c8.
              super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppGVar10 = local_1c8.
               super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1a8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1a8._8_8_);
      ppGVar5 = local_1c8.
                super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppGVar10 = local_1c8.
                 super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  while( true ) {
    ppGVar6 = local_1c8.
              super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = ppGVar5 ==
            local_1c8.
            super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    local_1c8.
    super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppGVar10;
    if (bVar4) goto LAB_00a313f3;
    pcVar1 = (char *)*ppGVar5;
    file_content_00._M_str = pcVar1;
    file_content_00._M_len = local_178._0_8_;
    annotation_test_util::GetAnnotationSubstring
              ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_1a8,
               (annotation_test_util *)local_178._8_8_,file_content_00,(Annotation *)annotation);
    __s1 = local_1a8._8_8_;
    local_1d8[0] = local_198;
    local_1d8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_198 == false) break;
    sVar2 = CONCAT71(local_1a8._1_7_,local_1a8[0]);
    switch(sVar2) {
    case 7:
      if (*(int *)(local_1a8._8_8_ + 3) == 0x646c6569 && *(int *)local_1a8._8_8_ == 0x69667372) {
        local_1d8._0_4_ = (uint32_t  [1])0x0;
        in_stack_fffffffffffffe00 = *(undefined4 *)(pcVar1 + 0x40);
        annotation = (undefined1  [8])&stack0xfffffffffffffe00;
        testing::internal::
        CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                  ((internal *)local_1f8,"GeneratedCodeInfo_Annotation_Semantic_NONE",
                   "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)local_1d8,
                   (GeneratedCodeInfo_Annotation_Semantic *)&stack0xfffffffffffffe00);
        if (local_1f8[0] != (string)0x0) goto LAB_00a312bd;
        testing::Message::Message((Message *)local_1d8);
        annotation = (undefined1  [8])(anon_var_dwarf_a22956 + 5);
        if ((__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
             )auStack_1f0 !=
            (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
             )0x0) {
          annotation = *(undefined1 (*) [8])auStack_1f0;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                   ,0x15b,(char *)annotation);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
LAB_00a312a5:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe00);
        if ((long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + 8))();
        }
        goto LAB_00a312bd;
      }
      break;
    case 0xb:
      iVar7 = bcmp((void *)local_1a8._8_8_,"set_rsfield",sVar2);
      if (iVar7 != 0) {
        pcVar9 = "add_rsfield";
        goto LAB_00a31174;
      }
LAB_00a31184:
      local_1d8._0_4_ = (uint32_t  [1])0x1;
      in_stack_fffffffffffffe00 = *(undefined4 *)(pcVar1 + 0x40);
      annotation = (undefined1  [8])&stack0xfffffffffffffe00;
      testing::internal::
      CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                ((internal *)local_1f8,"GeneratedCodeInfo_Annotation_Semantic_SET",
                 "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)local_1d8,
                 (GeneratedCodeInfo_Annotation_Semantic *)&stack0xfffffffffffffe00);
      if (local_1f8[0] == (string)0x0) {
        testing::Message::Message((Message *)local_1d8);
        annotation = (undefined1  [8])(anon_var_dwarf_a22956 + 5);
        if ((__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
             )auStack_1f0 !=
            (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
             )0x0) {
          annotation = *(undefined1 (*) [8])auStack_1f0;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                   ,0x15f,(char *)annotation);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
        goto LAB_00a312a5;
      }
LAB_00a312bd:
      if (auStack_1f0 != (undefined1  [8])0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)auStack_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_1f0);
      }
      break;
    case 0xd:
      pcVar9 = "clear_rsfield";
LAB_00a31174:
      iVar7 = bcmp((void *)__s1,pcVar9,sVar2);
      if (iVar7 == 0) goto LAB_00a31184;
      break;
    case 0xf:
      iVar7 = bcmp((void *)local_1a8._8_8_,"mutable_rsfield",sVar2);
      if (iVar7 == 0) {
        local_1d8._0_4_ = (uint32_t  [1])0x2;
        in_stack_fffffffffffffe00 = *(undefined4 *)(pcVar1 + 0x40);
        annotation = (undefined1  [8])&stack0xfffffffffffffe00;
        testing::internal::
        CmpHelperEQ<google::protobuf::GeneratedCodeInfo_Annotation_Semantic,google::protobuf::GeneratedCodeInfo_Annotation_Semantic>
                  ((internal *)local_1f8,"GeneratedCodeInfo_Annotation_Semantic_ALIAS",
                   "annotation->semantic()",(GeneratedCodeInfo_Annotation_Semantic *)local_1d8,
                   (GeneratedCodeInfo_Annotation_Semantic *)&stack0xfffffffffffffe00);
        if (local_1f8[0] == (string)0x0) {
          testing::Message::Message((Message *)local_1d8);
          annotation = (undefined1  [8])(anon_var_dwarf_a22956 + 5);
          if ((__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
               )auStack_1f0 !=
              (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
               )0x0) {
            annotation = *(undefined1 (*) [8])auStack_1f0;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffffe00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                     ,0x162,(char *)annotation);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffffe00,(Message *)local_1d8);
          goto LAB_00a312a5;
        }
        goto LAB_00a312bd;
      }
    }
    ppGVar5 = (pointer)((long *)ppGVar5 + 1);
    ppGVar10 = local_1c8.
               super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_1c8.
    super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppGVar6;
  }
  testing::Message::Message((Message *)&stack0xfffffffffffffe00);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_1f8,(internal *)local_1d8,(AssertionResult *)"substring.has_value()",
             "false","true",(char *)in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_1b0,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
             ,0x158,(char *)local_1f8);
  testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&stack0xfffffffffffffe00);
LAB_00a313a9:
  testing::internal::AssertHelper::~AssertHelper(&local_1b0);
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,local_1e8._0_8_ + 1);
  }
  if ((long *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00) + 8))();
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1d8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1d8._8_8_);
  }
LAB_00a313f3:
  if (local_1c8.
      super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT71(local_190._1_7_,local_190[0]);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_180 - (long)pvVar3);
  }
  if ((undefined1 *)local_178._0_8_ != local_168) {
    operator_delete((void *)local_178._0_8_,CONCAT71(local_168._1_7_,local_168[0]) + 1);
  }
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)(local_168 + 0x10));
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_128);
  return;
}

Assistant:

TEST_F(CppMetadataTest, AnnotatesCordSemantics) {
  FileDescriptorProto file;
  GeneratedCodeInfo info;
  std::string pb_h;
  atu::AddFile("test.proto", kCordFieldTestFile);
  EXPECT_TRUE(CaptureMetadata("test.proto", &file, &pb_h, &info, nullptr,
                              nullptr, nullptr));
  EXPECT_EQ("Message", file.message_type(0).name());
  std::vector<int> field_path{FileDescriptorProto::kMessageTypeFieldNumber, 0,
                              DescriptorProto::kFieldFieldNumber, 0};
  std::vector<const GeneratedCodeInfo::Annotation*> annotations;
  atu::FindAnnotationsOnPath(info, "test.proto", field_path, &annotations);
  EXPECT_TRUE(!annotations.empty());
  for (const auto* annotation : annotations) {
    auto substring = atu::GetAnnotationSubstring(pb_h, *annotation);
    ASSERT_TRUE(substring.has_value());
    if (*substring == "sfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_NONE,
                annotation->semantic());
    } else if (*substring == "set_sfield" || *substring == "clear_sfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_SET,
                annotation->semantic());
    } else if (*substring == "mutable_sfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_ALIAS,
                annotation->semantic());
    }
  }
  field_path.back() = 1;
  annotations.clear();
  atu::FindAnnotationsOnPath(info, "test.proto", field_path, &annotations);
  EXPECT_TRUE(!annotations.empty());
  for (const auto* annotation : annotations) {
    auto substring = atu::GetAnnotationSubstring(pb_h, *annotation);
    ASSERT_TRUE(substring.has_value());
    if (*substring == "rsfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_NONE,
                annotation->semantic());
    } else if (*substring == "set_rsfield" || *substring == "clear_rsfield" ||
               *substring == "add_rsfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_SET,
                annotation->semantic());
    } else if (*substring == "mutable_rsfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_ALIAS,
                annotation->semantic());
    }
  }
}